

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  char *pcVar1;
  ImGuiSettingsHandler *pIVar2;
  ImGuiContext *pIVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  pIVar3 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  iVar5 = (pIVar3->SettingsIniData).Buf.Capacity;
  if (iVar5 < 0) {
    iVar5 = iVar5 / 2 + iVar5;
    iVar8 = 0;
    if (0 < iVar5) {
      iVar8 = iVar5;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pcVar4 = (char *)(*GImAllocatorAllocFunc)((size_t)iVar8,GImAllocatorUserData);
    pcVar1 = (pIVar3->SettingsIniData).Buf.Data;
    if (pcVar1 != (char *)0x0) {
      memcpy(pcVar4,pcVar1,(long)(pIVar3->SettingsIniData).Buf.Size);
      pcVar1 = (pIVar3->SettingsIniData).Buf.Data;
      if (pcVar1 != (char *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pcVar1,GImAllocatorUserData);
    }
    (pIVar3->SettingsIniData).Buf.Data = pcVar4;
    (pIVar3->SettingsIniData).Buf.Capacity = iVar8;
  }
  (pIVar3->SettingsIniData).Buf.Size = 0;
  if ((pIVar3->SettingsIniData).Buf.Capacity == 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pcVar4 = (char *)(*GImAllocatorAllocFunc)(8,GImAllocatorUserData);
    pcVar1 = (pIVar3->SettingsIniData).Buf.Data;
    if (pcVar1 != (char *)0x0) {
      memcpy(pcVar4,pcVar1,(long)(pIVar3->SettingsIniData).Buf.Size);
      pcVar1 = (pIVar3->SettingsIniData).Buf.Data;
      if (pcVar1 != (char *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pcVar1,GImAllocatorUserData);
    }
    (pIVar3->SettingsIniData).Buf.Data = pcVar4;
    (pIVar3->SettingsIniData).Buf.Capacity = 8;
  }
  (pIVar3->SettingsIniData).Buf.Data[(pIVar3->SettingsIniData).Buf.Size] = '\0';
  (pIVar3->SettingsIniData).Buf.Size = (pIVar3->SettingsIniData).Buf.Size + 1;
  if (0 < (pIVar3->SettingsHandlers).Size) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pIVar2 = (pIVar3->SettingsHandlers).Data;
      (**(code **)((long)&pIVar2->WriteAllFn + lVar6))
                (pIVar3,(long)&pIVar2->TypeName + lVar6,&pIVar3->SettingsIniData);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x30;
    } while (lVar7 < (pIVar3->SettingsHandlers).Size);
  }
  if (out_size != (size_t *)0x0) {
    *out_size = (long)(pIVar3->SettingsIniData).Buf.Size - 1;
  }
  return (pIVar3->SettingsIniData).Buf.Data;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}